

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O2

uint64_t bloaty::TryReadPcPair(CU *cu,GeneralDIE *die,RangeSink *sink)

{
  uint64_t vmsize;
  uint64_t vmaddr;
  
  if ((die->low_pc).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == true) {
    vmaddr = (die->low_pc).super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload._M_value;
    if ((die->high_pc_addr).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged == true) {
      vmsize = (die->high_pc_addr).super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload._M_value - vmaddr;
    }
    else {
      if ((die->high_pc_size).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged != true) goto LAB_0019e21a;
      vmsize = (die->high_pc_size).super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload._M_value;
    }
    RangeSink::AddVMRangeIgnoreDuplicate(sink,"dwarf_pcpair",vmaddr,vmsize,&cu->unit_name_);
  }
  else {
LAB_0019e21a:
    vmaddr = 0;
  }
  return vmaddr;
}

Assistant:

uint64_t TryReadPcPair(const dwarf::CU& cu, const GeneralDIE& die,
                       RangeSink* sink) {
  uint64_t addr;
  uint64_t size;

  if (!die.low_pc) return 0;
  addr = *die.low_pc;

  if (die.high_pc_addr) {
    size = *die.high_pc_addr - addr;
  } else if (die.high_pc_size) {
    size = *die.high_pc_size;
  } else{
    return 0;
  }

  sink->AddVMRangeIgnoreDuplicate("dwarf_pcpair", addr, size, cu.unit_name());
  return addr;
}